

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator+=(Fad<double> *this,FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *x)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  double *pdVar15;
  
  pFVar7 = (x->fadexpr_).left_;
  pFVar8 = (x->fadexpr_).right_;
  uVar2 = (pFVar7->dx_).num_elts;
  uVar3 = (pFVar8->dx_).num_elts;
  uVar10 = uVar3;
  if ((int)uVar3 < (int)uVar2) {
    uVar10 = uVar2;
  }
  if (uVar10 != 0) {
    uVar4 = (this->dx_).num_elts;
    uVar12 = (ulong)uVar4;
    if (uVar12 == 0) {
      (this->dx_).num_elts = uVar10;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar10) {
        uVar12 = (long)(int)uVar10 << 3;
      }
      pdVar9 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar9;
      pFVar7 = (x->fadexpr_).left_;
      iVar5 = (pFVar7->dx_).num_elts;
      if ((iVar5 == 0) || ((((x->fadexpr_).right_)->dx_).num_elts == 0)) {
        if (0 < (int)uVar10) {
          pFVar8 = (x->fadexpr_).right_;
          iVar6 = (pFVar8->dx_).num_elts;
          uVar12 = (ulong)uVar10;
          lVar13 = 0;
          do {
            pdVar15 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar13);
            if (iVar5 == 0) {
              pdVar15 = &pFVar7->defaultVal;
            }
            pdVar14 = (double *)((long)(pFVar8->dx_).ptr_to_data + lVar13);
            if (iVar6 == 0) {
              pdVar14 = &pFVar8->defaultVal;
            }
            dVar1 = pFVar8->val_;
            *(double *)((long)pdVar9 + lVar13) =
                 (*pdVar15 * dVar1 - pFVar7->val_ * *pdVar14) / (dVar1 * dVar1);
            lVar13 = lVar13 + 8;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else if (0 < (int)uVar10) {
        pdVar15 = (pFVar7->dx_).ptr_to_data;
        pFVar8 = (x->fadexpr_).right_;
        pdVar14 = (pFVar8->dx_).ptr_to_data;
        uVar12 = 0;
        do {
          dVar1 = pFVar8->val_;
          pdVar9[uVar12] =
               (pdVar15[uVar12] * dVar1 - pFVar7->val_ * pdVar14[uVar12]) / (dVar1 * dVar1);
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
    }
    else {
      pdVar9 = (this->dx_).ptr_to_data;
      if (uVar2 == 0 || uVar3 == 0) {
        if (0 < (int)uVar4) {
          lVar13 = 0;
          do {
            pdVar15 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar13);
            if (uVar2 == 0) {
              pdVar15 = &pFVar7->defaultVal;
            }
            pdVar14 = (double *)((long)(pFVar8->dx_).ptr_to_data + lVar13);
            if (uVar3 == 0) {
              pdVar14 = &pFVar8->defaultVal;
            }
            dVar1 = pFVar8->val_;
            *(double *)((long)pdVar9 + lVar13) =
                 (*pdVar15 * dVar1 - pFVar7->val_ * *pdVar14) / (dVar1 * dVar1) +
                 *(double *)((long)pdVar9 + lVar13);
            lVar13 = lVar13 + 8;
          } while (uVar12 << 3 != lVar13);
        }
      }
      else if (0 < (int)uVar4) {
        pdVar15 = (pFVar7->dx_).ptr_to_data;
        pdVar14 = (pFVar8->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          dVar1 = pFVar8->val_;
          pdVar9[uVar11] =
               (pdVar15[uVar11] * dVar1 - pFVar7->val_ * pdVar14[uVar11]) / (dVar1 * dVar1) +
               pdVar9[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
    }
  }
  this->val_ = ((x->fadexpr_).left_)->val_ / ((x->fadexpr_).right_)->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}